

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBroadphaseProxy.h
# Opt level: O2

bool __thiscall
btBroadphasePairSortPredicate::operator()
          (btBroadphasePairSortPredicate *this,btBroadphasePair *a,btBroadphasePair *b)

{
  btBroadphaseProxy *pbVar1;
  btBroadphaseProxy *pbVar2;
  btBroadphaseProxy *pbVar3;
  btBroadphaseProxy *pbVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  pbVar1 = a->m_pProxy0;
  iVar8 = -1;
  iVar6 = -1;
  iVar9 = iVar6;
  if (pbVar1 != (btBroadphaseProxy *)0x0) {
    iVar9 = pbVar1->m_uniqueId;
  }
  pbVar2 = b->m_pProxy0;
  if (pbVar2 != (btBroadphaseProxy *)0x0) {
    iVar6 = pbVar2->m_uniqueId;
  }
  pbVar3 = a->m_pProxy1;
  iVar7 = -1;
  if (pbVar3 != (btBroadphaseProxy *)0x0) {
    iVar7 = pbVar3->m_uniqueId;
  }
  pbVar4 = b->m_pProxy1;
  if (pbVar4 != (btBroadphaseProxy *)0x0) {
    iVar8 = pbVar4->m_uniqueId;
  }
  bVar5 = true;
  if (((iVar9 <= iVar6) && (bVar5 = iVar8 < iVar7 && pbVar1 == pbVar2, pbVar1 == pbVar2)) &&
     (iVar7 <= iVar8)) {
    if (pbVar3 == pbVar4) {
      bVar5 = b->m_algorithm < a->m_algorithm;
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool operator() ( const btBroadphasePair& a, const btBroadphasePair& b ) const
		{
			const int uidA0 = a.m_pProxy0 ? a.m_pProxy0->m_uniqueId : -1;
			const int uidB0 = b.m_pProxy0 ? b.m_pProxy0->m_uniqueId : -1;
			const int uidA1 = a.m_pProxy1 ? a.m_pProxy1->m_uniqueId : -1;
			const int uidB1 = b.m_pProxy1 ? b.m_pProxy1->m_uniqueId : -1;

			 return uidA0 > uidB0 || 
				(a.m_pProxy0 == b.m_pProxy0 && uidA1 > uidB1) ||
				(a.m_pProxy0 == b.m_pProxy0 && a.m_pProxy1 == b.m_pProxy1 && a.m_algorithm > b.m_algorithm); 
		}